

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O2

void __thiscall DifferentialEquation::prepareNextState(DifferentialEquation *this)

{
  bool bVar1;
  ulong uVar2;
  code *pcVar3;
  int i;
  long lVar4;
  
  uVar2 = 1;
  for (lVar4 = 0; lVar4 < this->eqnTermAmount; lVar4 = lVar4 + 1) {
    if ((uVar2 & 1) == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (**(code **)((long)((this->eqnIntegrators).
                                  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar4]->
                                 super_StochasticProcess).super_Parametric._vptr_Parametric + 0x30))
                        ();
    }
  }
  if ((uVar2 & 1) == 0) {
    bVar1 = false;
  }
  else {
    pcVar3 = (code *)this->eqnMethodPtr;
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *(long *)((long)&(this->super_StochasticVariable).
                                                    super_StochasticProcess.super_Parametric.
                                                    _vptr_Parametric + *(long *)&this->field_0x158)
                                   + -1);
    }
    (*pcVar3)();
    bVar1 = true;
  }
  (this->super_StochasticVariable).super_StochasticProcess.stochNextStateIsPrepared = bVar1;
  return;
}

Assistant:

void DifferentialEquation::prepareNextState()
{
	bool allStatesPrepared = true;
	for (int i=0; i<eqnTermAmount; ++i)
		allStatesPrepared = allStatesPrepared && (*eqnIntegrators[i]).isNextStatePrepared();
	
	if (allStatesPrepared) {
		(this->*eqnMethodPtr)();
		stochNextStateIsPrepared = true;
	}
	else
		stochNextStateIsPrepared = false;
}